

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::LexNewLine(Lexer *this)

{
  int iVar1;
  long in_RDI;
  int next;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  iVar1 = Next((Lexer *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  if (((iVar1 == 0xd) || (iVar1 == 10)) && (iVar1 != *(int *)(in_RDI + 0x30))) {
    iVar1 = Next((Lexer *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
    *(int *)(in_RDI + 0x30) = iVar1;
  }
  else {
    *(int *)(in_RDI + 0x30) = iVar1;
  }
  *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
  *(undefined4 *)(in_RDI + 0x38) = 0;
  return;
}

Assistant:

void Lexer::LexNewLine()
    {
        int next = Next();
        if ((next == '\r' || next == '\n') && next != current_)
            current_ = Next();
        else
            current_ = next;
        ++line_;
        column_ = 0;
    }